

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O0

void google::VLOG2Initializer(void)

{
  VModuleInfo *pVVar1;
  int iVar2;
  char *pcVar3;
  undefined8 this;
  int local_6c;
  VModuleInfo *info;
  int module_level;
  allocator local_49;
  string local_48 [8];
  string pattern;
  VModuleInfo *tail;
  VModuleInfo *head;
  char *sep;
  char *vmodule;
  
  ::glog_internal_namespace_::Mutex::AssertHeld((Mutex *)vmodule_lock);
  inited_vmodule = 0;
  sep = (char *)std::__cxx11::string::c_str();
  tail = (VModuleInfo *)0x0;
  pattern.field_2._8_8_ = 0;
  do {
    pcVar3 = strchr(sep,0x3d);
    if (pcVar3 == (char *)0x0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,sep,(long)pcVar3 - (long)sep,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    iVar2 = __isoc99_sscanf(pcVar3,"=%d",&info);
    this = pattern.field_2._8_8_;
    pVVar1 = tail;
    if (iVar2 == 1) {
      this = operator_new(0x30);
      VModuleInfo::VModuleInfo((VModuleInfo *)this);
      std::__cxx11::string::operator=((string *)this,local_48);
      ((VModuleInfo *)this)->vlog_level = (int32)info;
      pVVar1 = (VModuleInfo *)this;
      if (tail != (VModuleInfo *)0x0) {
        *(undefined8 *)(pattern.field_2._8_8_ + 0x28) = this;
        pVVar1 = tail;
      }
    }
    tail = pVVar1;
    pattern.field_2._8_8_ = this;
    pcVar3 = strchr(pcVar3,0x2c);
    if (pcVar3 == (char *)0x0) {
      local_6c = 3;
      sep = (char *)0x0;
    }
    else {
      sep = pcVar3 + 1;
      local_6c = 0;
    }
    std::__cxx11::string::~string(local_48);
  } while (local_6c == 0);
  if (tail != (VModuleInfo *)0x0) {
    *(VModuleInfo **)(pattern.field_2._8_8_ + 0x28) = vmodule_list;
    vmodule_list = tail;
  }
  inited_vmodule = 1;
  return;
}

Assistant:

static void VLOG2Initializer() {
  vmodule_lock.AssertHeld();
  // Can now parse --vmodule flag and initialize mapping of module-specific
  // logging levels.
  inited_vmodule = false;
  const char* vmodule = FLAGS_vmodule.c_str();
  const char* sep;
  VModuleInfo* head = NULL;
  VModuleInfo* tail = NULL;
  while ((sep = strchr(vmodule, '=')) != NULL) {
    string pattern(vmodule, sep - vmodule);
    int module_level;
    if (sscanf(sep, "=%d", &module_level) == 1) {
      VModuleInfo* info = new VModuleInfo;
      info->module_pattern = pattern;
      info->vlog_level = module_level;
      if (head)  tail->next = info;
      else  head = info;
      tail = info;
    }
    // Skip past this entry
    vmodule = strchr(sep, ',');
    if (vmodule == NULL) break;
    vmodule++;  // Skip past ","
  }
  if (head) {  // Put them into the list at the head:
    tail->next = vmodule_list;
    vmodule_list = head;
  }
  inited_vmodule = true;
}